

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcBooleanClippingResult::IfcBooleanClippingResult
          (IfcBooleanClippingResult *this)

{
  *(undefined ***)&(this->super_IfcBooleanResult).field_0x80 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x88 = 0;
  *(char **)&this->field_0x90 = "IfcBooleanClippingResult";
  IfcBooleanResult::IfcBooleanResult
            (&this->super_IfcBooleanResult,&PTR_construction_vtable_24__00772200);
  (this->super_IfcBooleanResult).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x772148;
  *(undefined8 *)&(this->super_IfcBooleanResult).field_0x80 = 0x7721e8;
  *(undefined8 *)
   &(this->super_IfcBooleanResult).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x772170;
  *(undefined8 *)
   &(this->super_IfcBooleanResult).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x772198;
  *(undefined8 *)&(this->super_IfcBooleanResult).field_0x70 = 0x7721c0;
  return;
}

Assistant:

IfcBooleanClippingResult() : Object("IfcBooleanClippingResult") {}